

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_0::PruneFileAndDepsMarkingAsVisited
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *file_00;
  int local_64;
  int i;
  const_iterator local_48;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_40;
  FileDescriptor **local_38;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_30;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_28;
  iterator iter;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_visited_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  FileDescriptor *file_local;
  
  iter._M_current = (FileDescriptor **)files_visited;
  files_local = (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)file;
  local_30._M_current =
       (FileDescriptor **)
       std::
       vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::begin(files);
  local_38 = (FileDescriptor **)
             std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::end(files);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const**,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>,google::protobuf::FileDescriptor_const*>
                       (local_30,(__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                  )local_38,(FileDescriptor **)&files_local);
  local_40._M_current =
       (FileDescriptor **)
       std::
       vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::end(files);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>
    ::__normal_iterator<google::protobuf::FileDescriptor_const**>
              ((__normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>
                *)&local_48,&local_28);
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::erase(files,local_48);
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)iter._M_current,(value_type *)&files_local);
  for (local_64 = 0; iVar2 = FileDescriptor::dependency_count((FileDescriptor *)files_local),
      local_64 < iVar2; local_64 = local_64 + 1) {
    file_00 = FileDescriptor::dependency((FileDescriptor *)files_local,local_64);
    PruneFileAndDepsMarkingAsVisited
              (file_00,files,
               (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)iter._M_current);
  }
  return;
}

Assistant:

void PruneFileAndDepsMarkingAsVisited(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files,
    std::set<const FileDescriptor*>* files_visited) {
  std::vector<const FileDescriptor*>::iterator iter =
      std::find(files->begin(), files->end(), file);
  if (iter != files->end()) {
    files->erase(iter);
  }
  files_visited->insert(file);
  for (int i = 0; i < file->dependency_count(); i++) {
    PruneFileAndDepsMarkingAsVisited(file->dependency(i), files, files_visited);
  }
}